

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void GetLine(FILE *file,string *str_line)

{
  ostream *poVar1;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  scoped_array<char> *this;
  char *in_RSI;
  FILE *in_RDI;
  int read_len;
  scoped_array<char> line;
  ptrdiff_t in_stack_fffffffffffffdd8;
  scoped_array<char> *in_stack_fffffffffffffde0;
  Logger *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  int line_00;
  allocator *paVar4;
  string *in_stack_fffffffffffffe68;
  string *file_00;
  undefined8 in_stack_fffffffffffffe70;
  LogSeverity LVar5;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [36];
  Logger local_dc;
  int local_d8;
  allocator local_d1;
  string local_d0 [39];
  undefined1 local_a9 [37];
  Logger local_84;
  scoped_array<char> local_80;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  char *local_10;
  FILE *local_8;
  
  line_00 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  LVar5 = (LogSeverity)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  if (in_RDI == (FILE *)0x0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"GetLine",&local_71);
    poVar1 = Logger::Start(LVar5,in_stack_fffffffffffffe68,line_00,in_stack_fffffffffffffe58);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xad);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffdf0);
    abort();
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar2 = (char *)operator_new__(0xa00000);
  scoped_array<char>::scoped_array(&local_80,pcVar2);
  pcVar2 = scoped_array<char>::get(&local_80);
  pcVar2 = fgets(pcVar2,0xa00000,local_8);
  if (pcVar2 != (char *)0x0) {
    __s = scoped_array<char>::get(&local_80);
    LVar5 = (LogSeverity)((ulong)pcVar2 >> 0x20);
    sVar3 = strlen(__s);
    local_d8 = (int)sVar3;
    pcVar2 = scoped_array<char>::operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if (*pcVar2 == '\n') {
      pcVar2 = scoped_array<char>::operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      *pcVar2 = '\0';
      if ((1 < local_d8) &&
         (pcVar2 = scoped_array<char>::operator[]
                             (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8), *pcVar2 == '\r')
         ) {
        pcVar2 = scoped_array<char>::operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
        ;
        *pcVar2 = '\0';
      }
    }
    else {
      Logger::Logger(&local_dc,FATAL);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"GetLine",&local_129);
      poVar1 = Logger::Start(LVar5,in_stack_fffffffffffffe68,line_00,in_stack_fffffffffffffe58);
      std::operator<<(poVar1,
                      "Encountered a too-long line:                   Cannot find the \'\\n\' char.                     Please check the data."
                     );
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      Logger::~Logger(in_stack_fffffffffffffdf0);
    }
    this = (scoped_array<char> *)scoped_array<char>::get(&local_80);
    std::__cxx11::string::assign(local_10);
    scoped_array<char>::~scoped_array(this);
    return;
  }
  Logger::Logger(&local_84,ERR);
  LVar5 = (LogSeverity)((ulong)pcVar2 >> 0x20);
  file_00 = (string *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_a9 + 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
             ,(allocator *)file_00);
  paVar4 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"GetLine",paVar4);
  poVar1 = Logger::Start(LVar5,file_00,(int)((ulong)paVar4 >> 0x20),in_stack_fffffffffffffe58);
  poVar1 = std::operator<<(poVar1,"CHECK failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xaf);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"fgets(line.get(), kMaxLineSize, file)");
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  Logger::~Logger(in_stack_fffffffffffffdf0);
  abort();
}

Assistant:

inline void GetLine(FILE *file, std::string &str_line) {
  CHECK_NOTNULL(file);
  scoped_array<char> line(new char[kMaxLineSize]);
  CHECK_NOTNULL(fgets(line.get(), kMaxLineSize, file));
  int read_len = strlen(line.get());
  if (line[read_len-1] != '\n') {
    LOG(FATAL) << "Encountered a too-long line: \
                  Cannot find the '\\n' char.   \
                  Please check the data.";
  } else {
    line[read_len-1] = '\0';
    // Handle the format in DOS and Windows
    if (read_len > 1 && line[read_len-2] == '\r') {
      line[read_len-2] = '\0';
    }
  }
  str_line.assign(line.get());
}